

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::identifierOrKeyphrase(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  pointer ppVar4;
  bool local_79;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
  local_60 [3];
  key_type local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
  local_28;
  iterator search;
  int local_18;
  int id;
  int keyphrase;
  bool oneWord;
  Lexer *this_local;
  
  bVar2 = true;
  local_18 = 1;
  search.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
  ._M_cur._4_4_ = 1;
  while( true ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = isAlpha(*pcVar3);
    local_79 = true;
    if (!bVar1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
      bVar1 = isDigit(*pcVar3);
      local_79 = true;
      if (!bVar1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
        local_79 = isPunctuation(*pcVar3);
      }
    }
    if (local_79 == false) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = isPunctuation(*pcVar3);
    if (bVar1) {
      bVar2 = false;
    }
    if (bVar2) {
      search.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
      ._M_cur._4_4_ =
           search.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
           ._M_cur._4_4_ + 1;
    }
    local_18 = local_18 + 1;
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
       ::find(&tokenMap_abi_cxx11_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_60[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
       ::end(&tokenMap_abi_cxx11_);
  bVar2 = std::__detail::operator!=(&local_28,local_60);
  if (bVar2) {
    this->current = local_18 + -1 + this->current;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_false,_true>
                           *)&local_28);
    makeToken(__return_storage_ptr__,this,ppVar4->second);
  }
  else {
    this->current =
         search.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
         ._M_cur._4_4_ + -1 + this->current;
    makeToken(__return_storage_ptr__,this,IDENTIFIER);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::identifierOrKeyphrase()
{
    bool oneWord = true;
    int keyphrase = 1;
    int id = 1;
    while (isAlpha(source[start + keyphrase])
        || isDigit(source[start + keyphrase])
        || isPunctuation(source[start + keyphrase]))
    {
        if (isPunctuation(source[start + keyphrase])) oneWord = false;
        if (oneWord) id++;
        keyphrase++;
    }

    auto search = tokenMap.find(source.substr(start, keyphrase));
    if (search != tokenMap.end())
    {
        current += keyphrase - 1;
        return makeToken(search->second);
    }
    else
    {
        current += id - 1;
        return makeToken(TokenType::IDENTIFIER);
    }
}